

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O0

Point * MeshLib::Trait::getConformal(Point *__return_storage_ptr__,string *s)

{
  undefined8 uVar1;
  undefined1 local_458 [8];
  char line [1024];
  double pz;
  double py;
  double px;
  string subs;
  size_type pos;
  string *s_local;
  
  subs.field_2._8_8_ = std::__cxx11::string::find((char *)s,0x1338c2);
  std::__cxx11::string::substr((ulong)&px,(ulong)s);
  uVar1 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar1,"conformal=(%lf %lf %lf)%s",&py,&pz,line + 0x3f8,local_458);
  Point::Point(__return_storage_ptr__,py,pz,(double)line._1016_8_);
  std::__cxx11::string::~string((string *)&px);
  return __return_storage_ptr__;
}

Assistant:

Point Trait::getConformal(std::string s)
{
	std::string::size_type pos = s.find ("conformal");
	std::string subs = s.substr (pos);
	double px, py, pz;
	char line[1024];
	sscanf(subs.c_str (),"conformal=(%lf %lf %lf)%s",&px,&py,&pz,line);
	return Point(px,py,pz);
}